

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_stroke_arc(nk_command_buffer *b,float cx,float cy,float radius,float a_min,float a_max,
                  float line_thickness,nk_color c)

{
  void *pvVar1;
  float in_XMM0_Db;
  undefined1 auVar2 [16];
  float in_XMM1_Db;
  undefined1 auVar3 [16];
  float in_XMM2_Db;
  float in_XMM5_Db;
  
  if ((0xffffff < (uint)c && b != (nk_command_buffer *)0x0) &&
     (pvVar1 = nk_command_buffer_push(b,NK_COMMAND_ARC,0x28), pvVar1 != (void *)0x0)) {
    auVar2._0_4_ = (int)radius;
    auVar2._4_4_ = (int)line_thickness;
    auVar2._8_4_ = (int)in_XMM2_Db;
    auVar2._12_4_ = (int)in_XMM5_Db;
    auVar2 = pshuflw(auVar2,auVar2,0xe8);
    auVar3._0_4_ = (int)cx;
    auVar3._4_4_ = (int)cy;
    auVar3._8_4_ = (int)in_XMM0_Db;
    auVar3._12_4_ = (int)in_XMM1_Db;
    auVar3 = pshuflw(auVar3,auVar3,0xe8);
    *(int *)((long)pvVar1 + 0x10) = auVar3._0_4_;
    *(int *)((long)pvVar1 + 0x14) = auVar2._0_4_;
    *(float *)((long)pvVar1 + 0x18) = a_min;
    *(float *)((long)pvVar1 + 0x1c) = a_max;
    *(short *)((long)pvVar1 + 0x20) = c._0_2_;
    *(nk_byte *)((long)pvVar1 + 0x22) = c.b;
    *(nk_byte *)((long)pvVar1 + 0x23) = c.a;
  }
  return;
}

Assistant:

NK_API void
nk_stroke_arc(struct nk_command_buffer *b, float cx, float cy, float radius,
    float a_min, float a_max, float line_thickness, struct nk_color c)
{
    struct nk_command_arc *cmd;
    if (!b || c.a == 0) return;
    cmd = (struct nk_command_arc*)
        nk_command_buffer_push(b, NK_COMMAND_ARC, sizeof(*cmd));
    if (!cmd) return;
    cmd->line_thickness = (unsigned short)line_thickness;
    cmd->cx = (short)cx;
    cmd->cy = (short)cy;
    cmd->r = (unsigned short)radius;
    cmd->a[0] = a_min;
    cmd->a[1] = a_max;
    cmd->color = c;
}